

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_late_unknown_options_no_fail(void)

{
  int iVar1;
  ulong local_c0;
  size_t k_1;
  size_t k;
  size_t unknown_count_cpy;
  char **unknowns_cpy;
  size_t unknown_count;
  char **unknowns;
  size_t i;
  int b;
  int a;
  size_t expected_count;
  char *expected [2];
  char *args [7];
  cargo_t local_28;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init(&local_28,0,"program");
  if (iVar1 == 0) {
    memcpy(expected + 1,&DAT_0013ef70,0x38);
    expected_count = (long)"Missing --centauri" + 8;
    expected[0] = "--delta";
    _b = (char **)0x2;
    i._4_4_ = 0;
    i._0_4_ = 0;
    unknowns = (char **)0x0;
    unknown_count = 0;
    unknowns_cpy = (char **)0x0;
    unknown_count_cpy = 0;
    k = 0;
    cargo_set_flags(local_28,CARGO_NO_FAIL_UNKNOWN);
    cargo._4_4_ = cargo_add_option(local_28,0,"--alpha","an option","i",(long)&i + 4);
    cargo._4_4_ = cargo_add_option(local_28,0,"--beta -b","an option","i",&i);
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_parse(local_28,0,1,7,expected + 1);
      if (cargo._4_4_ == 0) {
        printf("a = %d\n",(ulong)i._4_4_);
        printf("b = %d\n",(ulong)(uint)i);
        if (i._4_4_ == 0x7b) {
          if ((uint)i == 3) {
            unknown_count = (size_t)cargo_get_unknown(local_28,(size_t *)&unknowns_cpy);
            if ((char **)unknown_count == (char **)0x0) {
              pcStack_18 = "Got NULL unknowns list";
            }
            else {
              for (unknowns = (char **)0x0; unknowns < unknowns_cpy;
                  unknowns = (char **)((long)unknowns + 1)) {
                printf("%s\n",*(undefined8 *)(unknown_count + (long)unknowns * 8));
              }
              printf("Check that \"unknowns\" has expected_count elements\n");
              if (unknowns_cpy == _b) {
                for (k_1 = 0; k_1 < unknowns_cpy; k_1 = k_1 + 1) {
                  printf("  %lu: \"%s\" -> \"%s\"\n",k_1 + 1,
                         *(undefined8 *)(unknown_count + k_1 * 8),expected[k_1 - 1]);
                  iVar1 = strcmp(*(char **)(unknown_count + k_1 * 8),expected[k_1 - 1]);
                  if (iVar1 != 0) {
                    pcStack_18 = "Array contains unexpected value";
                    goto LAB_00127e32;
                  }
                }
                unknown_count_cpy = (size_t)cargo_get_unknown_copy(local_28,&k);
                if ((char **)unknown_count_cpy == (char **)0x0) {
                  pcStack_18 = "Got NULL unknowns list (copy)";
                }
                else {
                  for (unknowns = (char **)0x0; unknowns < k;
                      unknowns = (char **)((long)unknowns + 1)) {
                    printf("%s\n",*(undefined8 *)(unknown_count_cpy + (long)unknowns * 8));
                  }
                  printf("Check that \"unknowns_cpy\" has expected_count elements\n");
                  if ((char **)k == _b) {
                    for (local_c0 = 0; local_c0 < k; local_c0 = local_c0 + 1) {
                      printf("  %lu: \"%s\" -> \"%s\"\n",local_c0 + 1,
                             *(undefined8 *)(unknown_count_cpy + local_c0 * 8),
                             expected[local_c0 - 1]);
                      iVar1 = strcmp(*(char **)(unknown_count_cpy + local_c0 * 8),
                                     expected[local_c0 - 1]);
                      if (iVar1 != 0) {
                        pcStack_18 = "Array contains unexpected value";
                        break;
                      }
                    }
                  }
                  else {
                    pcStack_18 = 
                    "unknowns_cpy array count unknown_count_cpy is not expected expected_count";
                  }
                }
              }
              else {
                pcStack_18 = "unknowns array count unknown_count is not expected expected_count";
              }
            }
          }
          else {
            pcStack_18 = "b != 3 after unknown option (check after)";
          }
        }
        else {
          pcStack_18 = "a != 123 after unknown option (check after)";
        }
      }
      else {
        pcStack_18 = "Parse failure on unknown option (late, no fail)";
      }
    }
    else {
      pcStack_18 = "Failed to add options";
    }
LAB_00127e32:
    cargo_free_commandline((char ***)&unknown_count_cpy,(int)k);
    cargo_destroy(&local_28);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_late_unknown_options_no_fail)
{
    char *args[] =
    {
        "program", "--alpha", "123", "--centauri", "--delta", "--beta", "3"
    };
    char *expected[] = { "--centauri", "--delta" };
    size_t expected_count = sizeof(expected) / sizeof(expected[0]);
    int a = 0;
    int b = 0;
    size_t i = 0;
    const char **unknowns = NULL;
    size_t unknown_count = 0;
    char **unknowns_cpy = NULL;
    size_t unknown_count_cpy = 0;

    cargo_set_flags(cargo, CARGO_NO_FAIL_UNKNOWN);

    ret = cargo_add_option(cargo, 0, "--alpha", "an option", "i", &a);
    ret = cargo_add_option(cargo, 0, "--beta -b", "an option", "i", &b);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failure on unknown option (late, no fail)");

    printf("a = %d\n", a);
    printf("b = %d\n", b);
    cargo_assert(a == 123, "a != 123 after unknown option (check after)");
    cargo_assert(b == 3,   "b != 3 after unknown option (check after)");

    unknowns = cargo_get_unknown(cargo, &unknown_count);
    cargo_assert(unknowns, "Got NULL unknowns list");
    for (i = 0; i < unknown_count; i++) printf("%s\n", unknowns[i]);
    cargo_assert_str_array(unknown_count, expected_count, unknowns, expected);

    unknowns_cpy = cargo_get_unknown_copy(cargo, &unknown_count_cpy);
    cargo_assert(unknowns_cpy, "Got NULL unknowns list (copy)");
    for (i = 0; i < unknown_count_cpy; i++) printf("%s\n", unknowns_cpy[i]);
    cargo_assert_str_array(unknown_count_cpy, expected_count, unknowns_cpy, expected);

    _TEST_CLEANUP();
    cargo_free_commandline(&unknowns_cpy, unknown_count_cpy);
}